

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

char * __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::PrintIntegralDigitsFromRightFast
          (anon_unknown_0 *this,uint128 v,char *p)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  
  pcVar3 = (char *)v.hi_;
  uVar5 = v.lo_;
  if (uVar5 != 0) {
    do {
      iVar1 = (int)this + (int)((ulong)this / 10) * -10 + (int)(uVar5 % 10) * 6;
      uVar4 = (iVar1 * 0xcd & 0xffffU) >> 0xb;
      this = (anon_unknown_0 *)((ulong)uVar4 + (uVar5 % 10) * 0x1999999999999999 + (ulong)this / 10)
      ;
      pcVar3[-1] = (char)iVar1 + (char)uVar4 * -10 | 0x30;
      pcVar3 = pcVar3 + -1;
      bVar2 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar2);
  }
  do {
    pcVar3[-1] = (char)this + (char)(anon_unknown_0 *)((ulong)this / 10) * -10 | 0x30;
    pcVar3 = pcVar3 + -1;
    bVar2 = (anon_unknown_0 *)0x9 < this;
    this = (anon_unknown_0 *)((ulong)this / 10);
  } while (bVar2);
  return pcVar3;
}

Assistant:

char *PrintIntegralDigitsFromRightFast(uint128 v, char *p) {
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  while (high != 0) {
    char carry = DivideBy10WithCarry(&high, 0);
    carry = DivideBy10WithCarry(&low, carry);
    *--p = carry + '0';
  }
  return PrintIntegralDigitsFromRightFast(low, p);
}